

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O1

Pattern * slang::ast::ConstantPattern::fromSyntax
                    (ExpressionPatternSyntax *syntax,Type *targetType,ASTContext *context)

{
  Compilation *this;
  undefined1 auVar1 [16];
  bool bVar2;
  bitmask<slang::ast::IntegralFlags> bVar3;
  bool bVar4;
  bitwidth_t width;
  Expression *this_00;
  InvalidPattern *pIVar5;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff98;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  this = ((context->scope).ptr)->compilation;
  bVar2 = Type::isIntegral(targetType);
  if ((bVar2) && (bVar2 = Type::isFourState(targetType), !bVar2)) {
    bVar3 = Type::getIntegralFlags(targetType);
    width = Type::getBitWidth(targetType);
    targetType = Compilation::getType
                           (this,width,(bitmask<slang::ast::IntegralFlags>)(bVar3.m_bits | 2));
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = context;
  this_00 = Expression::bindRValue
                      ((Expression *)targetType,(Type *)(syntax->expr).ptr,(ExpressionSyntax *)0x0,
                       (SourceRange)(auVar1 << 0x40),(ASTContext *)0x0,in_stack_ffffffffffffff98);
  bVar4 = Expression::bad(this_00);
  bVar2 = true;
  if (!bVar4) {
    ASTContext::eval((ConstantValue *)&local_58,context,this_00,(bitmask<slang::ast::EvalFlags>)0x0)
    ;
    bVar2 = local_58._M_index == '\0';
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_58);
  }
  if (bVar2) {
    pIVar5 = BumpAllocator::emplace<slang::ast::InvalidPattern,slang::ast::Pattern_const*&>
                       (&this->super_BumpAllocator,(Pattern **)&stack0xffffffffffffff98);
  }
  else {
    slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pIVar5 = (InvalidPattern *)
             BumpAllocator::
             emplace<slang::ast::ConstantPattern,slang::ast::Expression_const&,slang::SourceRange>
                       (&this->super_BumpAllocator,this_00,(SourceRange *)&stack0xffffffffffffff98);
  }
  return &pIVar5->super_Pattern;
}

Assistant:

Pattern& ConstantPattern::fromSyntax(const ExpressionPatternSyntax& syntax, const Type& targetType,
                                     const ASTContext& context) {
    // Bind the expression (it must be a constant).
    // We force integral types to be four-state here so that if we need to do a casex / casez
    // condition we will get the right result for unknowns.
    auto& comp = context.getCompilation();
    const Type* type = &targetType;
    if (type->isIntegral() && !type->isFourState()) {
        auto flags = type->getIntegralFlags() | IntegralFlags::FourState;
        type = &comp.getType(type->getBitWidth(), flags);
    }

    auto& expr = Expression::bindRValue(*type, *syntax.expr, {}, context);
    if (expr.bad() || !context.eval(expr))
        return badPattern(comp, nullptr);

    return *comp.emplace<ConstantPattern>(expr, syntax.sourceRange());
}